

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.cpp
# Opt level: O3

void __thiscall slang::parsing::ParserBase::prependSkippedTokens(ParserBase *this,Token *token)

{
  BumpAllocator *alloc;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EVP_PKEY_CTX *in_RDX;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> extraout_RDX_00;
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar2;
  Token TVar3;
  SmallVector<slang::parsing::Trivia,_8UL> buffer;
  Trivia TStack_c8;
  SmallVectorBase<slang::parsing::Trivia> local_b8 [3];
  
  local_b8[0].len = 0;
  local_b8[0].cap = 8;
  local_b8[0].data_ = (pointer)local_b8[0].firstElement;
  iVar1 = SmallVectorBase<slang::parsing::Token>::copy
                    (&(this->skippedTokens).super_SmallVectorBase<slang::parsing::Token>,
                     (EVP_PKEY_CTX *)this->alloc,in_RDX);
  tokens._M_ptr._4_4_ = extraout_var;
  tokens._M_ptr._0_4_ = iVar1;
  tokens._M_extent._M_extent_value = extraout_RDX._M_extent_value;
  Trivia::Trivia(&TStack_c8,SkippedTokens,tokens);
  SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>(local_b8,&TStack_c8)
  ;
  sVar2 = Token::trivia(token);
  SmallVectorBase<slang::parsing::Trivia>::
  append<__gnu_cxx::__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>_>
            (local_b8,sVar2._M_ptr,sVar2._M_ptr + sVar2._M_extent._M_extent_value._M_extent_value);
  alloc = this->alloc;
  iVar1 = SmallVectorBase<slang::parsing::Trivia>::copy(local_b8,(EVP_PKEY_CTX *)alloc,src);
  sVar2._M_ptr._4_4_ = extraout_var_00;
  sVar2._M_ptr._0_4_ = iVar1;
  sVar2._M_extent._M_extent_value = extraout_RDX_00._M_extent_value;
  TVar3 = Token::withTrivia(token,alloc,sVar2);
  *token = TVar3;
  (this->skippedTokens).super_SmallVectorBase<slang::parsing::Token>.len = 0;
  if (local_b8[0].data_ != (pointer)local_b8[0].firstElement) {
    operator_delete(local_b8[0].data_);
  }
  return;
}

Assistant:

void ParserBase::prependSkippedTokens(Token& token) {
    SmallVector<Trivia, 8> buffer;
    buffer.push_back(Trivia{TriviaKind::SkippedTokens, skippedTokens.copy(alloc)});
    buffer.append_range(token.trivia());

    token = token.withTrivia(alloc, buffer.copy(alloc));
    skippedTokens.clear();
}